

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

void __thiscall icu_63::UVector::setSize(UVector *this,int32_t newSize,UErrorCode *status)

{
  UBool UVar1;
  ulong uVar2;
  void *pvVar3;
  uint index;
  
  if (-1 < newSize) {
    index = this->count;
    if ((int)index < newSize) {
      UVar1 = ensureCapacity(this,newSize,status);
      if (UVar1 == '\0') {
        return;
      }
      uVar2 = (ulong)this->count;
      if (this->count < newSize) {
        do {
          this->elements[uVar2].pointer = (void *)0x0;
          uVar2 = uVar2 + 1;
        } while ((uint)newSize != uVar2);
      }
    }
    else if ((uint)newSize < index) {
      do {
        index = index - 1;
        pvVar3 = orphanElementAt(this,index);
        if ((pvVar3 != (void *)0x0) && (this->deleter != (UObjectDeleter *)0x0)) {
          (*this->deleter)(pvVar3);
        }
      } while (newSize < (int)index);
    }
    this->count = newSize;
  }
  return;
}

Assistant:

void UVector::setSize(int32_t newSize, UErrorCode &status) {
    int32_t i;
    if (newSize < 0) {
        return;
    }
    if (newSize > count) {
        if (!ensureCapacity(newSize, status)) {
            return;
        }
        UElement empty;
        empty.pointer = NULL;
        empty.integer = 0;
        for (i=count; i<newSize; ++i) {
            elements[i] = empty;
        }
    } else {
        /* Most efficient to count down */
        for (i=count-1; i>=newSize; --i) {
            removeElementAt(i);
        }
    }
    count = newSize;
}